

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall
libtorrent::dht_get_peers_reply_alert::~dht_get_peers_reply_alert(dht_get_peers_reply_alert *this)

{
  operator_delete(this,0x40);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_get_peers_reply_alert final : alert
	{
		// internal
		dht_get_peers_reply_alert(aux::stack_allocator& alloc
			, sha1_hash const& ih
			, std::vector<tcp::endpoint> const& v);

		static constexpr alert_category_t static_category = alert_category::dht_operation;
		TORRENT_DEFINE_ALERT(dht_get_peers_reply_alert, 87)

		std::string message() const override;

		sha1_hash info_hash;

		int num_peers() const;

#if TORRENT_ABI_VERSION == 1
		TORRENT_DEPRECATED
		void peers(std::vector<tcp::endpoint>& v) const;
#endif
		std::vector<tcp::endpoint> peers() const;

	private:
		std::reference_wrapper<aux::stack_allocator> m_alloc;
		int m_v4_num_peers = 0;
		int m_v6_num_peers = 0;
		aux::allocation_slot m_v4_peers_idx;
		aux::allocation_slot m_v6_peers_idx;
	}